

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O0

void * hashmap_get_with_hash(hashmap *map,void *key,uint64_t hash)

{
  int iVar1;
  uint64_t uVar2;
  bucket *entry;
  void *pvVar3;
  void *bitem;
  bucket *bucket;
  size_t i;
  uint64_t hash_local;
  void *key_local;
  hashmap *map_local;
  
  uVar2 = clip_hash(hash);
  bucket = (bucket *)(uVar2 & map->mask);
  do {
    entry = bucket_at(map,(size_t)bucket);
    if ((ulong)*entry >> 0x30 == 0) {
      return (void *)0x0;
    }
    if (((ulong)*entry & 0xffffffffffff) == uVar2) {
      pvVar3 = bucket_item(entry);
      if (map->compare == (_func_int_void_ptr_void_ptr_void_ptr *)0x0) {
        return pvVar3;
      }
      iVar1 = (*map->compare)(key,pvVar3,map->udata);
      if (iVar1 == 0) {
        return pvVar3;
      }
    }
    bucket = (bucket *)((ulong)&bucket->field_0x1 & map->mask);
  } while( true );
}

Assistant:

const void *hashmap_get_with_hash(struct hashmap *map, const void *key, 
    uint64_t hash)
{
    hash = clip_hash(hash);
    size_t i = hash & map->mask;
    while(1) {
        struct bucket *bucket = bucket_at(map, i);
        if (!bucket->dib) return NULL;
        if (bucket->hash == hash) {
            void *bitem = bucket_item(bucket);
            if (!map->compare || map->compare(key, bitem, map->udata) == 0) {
                return bitem;
            }
        }
        i = (i + 1) & map->mask;
    }
}